

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall wasm::FunctionValidator::visitRethrow(FunctionValidator *this,Rethrow *curr)

{
  bool result;
  Module *pMVar1;
  Type local_28;
  Type local_20;
  Rethrow *local_18;
  Rethrow *curr_local;
  FunctionValidator *this_local;
  
  local_18 = curr;
  curr_local = (Rethrow *)this;
  pMVar1 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  result = FeatureSet::hasExceptionHandling(&pMVar1->features);
  shouldBeTrue<wasm::Rethrow*>
            (this,result,local_18,
             "rethrow requires exception-handling [--enable-exception-handling]");
  local_20.id = (local_18->super_SpecificExpression<(wasm::Expression::Id)51>).super_Expression.type
                .id;
  wasm::Type::Type(&local_28,unreachable);
  shouldBeEqual<wasm::Rethrow*,wasm::Type>
            (this,local_20,local_28,local_18,"rethrow\'s type must be unreachable");
  noteRethrow(this,(Name)(local_18->target).super_IString.str,(Expression *)local_18);
  return;
}

Assistant:

void FunctionValidator::visitRethrow(Rethrow* curr) {
  shouldBeTrue(
    getModule()->features.hasExceptionHandling(),
    curr,
    "rethrow requires exception-handling [--enable-exception-handling]");
  shouldBeEqual(curr->type,
                Type(Type::unreachable),
                curr,
                "rethrow's type must be unreachable");
  noteRethrow(curr->target, curr);
}